

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

bool __thiscall
uWS::WebSocketProtocol<true>::consumeContinuation
          (WebSocketProtocol<true> *this,char **src,uint *length,void *user)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  
  if (*length < this->remainingBytes) {
    unmaskInplace(*src,*src + ((*length & 0xfffffffc) + 4),this->mask);
    uVar2 = this->remainingBytes - *length;
    this->remainingBytes = uVar2;
    bVar1 = handleFragment(this,*src,(ulong)*length,uVar2,(uint)this->opCode[(byte)this->opStack],
                           this->lastFin != '\0',user);
    if ((!bVar1) && ((*length & 3) != 0)) {
      rotateMask(4 - (*length & 3),this->mask);
    }
    bVar4 = false;
  }
  else {
    uVar5 = this->remainingBytes & 0xfffffffc;
    unmaskInplace(*src,*src + uVar5,this->mask);
    uVar2 = this->remainingBytes;
    for (uVar3 = 0; (uVar2 & 3) != uVar3; uVar3 = uVar3 + 1) {
      (*src)[uVar3 + (long)(int)uVar5] = (*src)[uVar3 + (long)(int)uVar5] ^ this->mask[uVar3];
    }
    bVar4 = false;
    bVar1 = handleFragment(this,*src,(ulong)this->remainingBytes,0,
                           (uint)this->opCode[(byte)this->opStack],this->lastFin != '\0',user);
    if (!bVar1) {
      if (this->lastFin != '\0') {
        this->opStack = this->opStack + -1;
      }
      uVar2 = this->remainingBytes;
      *src = *src + uVar2;
      *length = *length - uVar2;
      this->state = '\0';
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

inline bool consumeContinuation(char *&src, unsigned int &length, void *user) {
        if (remainingBytes <= length) {
            if (isServer) {
                int n = remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, mask);
                for (int i = 0, s = remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= mask[i];
                }
            }

            if (handleFragment(src, remainingBytes, 0, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (lastFin) {
                opStack--;
            }

            src += remainingBytes;
            length -= remainingBytes;
            state = READ_HEAD;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, mask);
            }

            remainingBytes -= length;
            if (handleFragment(src, length, remainingBytes, opCode[(unsigned char) opStack], lastFin, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), mask);
            }
            return false;
        }
    }